

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recipient.c
# Opt level: O0

_Bool COSE_Recipient_SetSenderKey
                (HCOSE_RECIPIENT h,cn_cbor *pKey,int destination,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor *pcVar3;
  cn_cbor_errback local_58;
  cn_cbor_errback cbor_err;
  cn_cbor *cn3;
  cn_cbor *cn2;
  cn_cbor *cn;
  _Bool f;
  COSE_RecipientInfo *p;
  cose_errback *perr_local;
  int destination_local;
  cn_cbor *pKey_local;
  HCOSE_RECIPIENT h_local;
  
  cn._7_1_ = false;
  cn3 = (cn_cbor *)0x0;
  cbor_err.pos = 0;
  cbor_err.err = CN_CBOR_NO_ERROR;
  _Var1 = IsValidRecipientHandle(h);
  if (_Var1) {
    if (pKey == (cn_cbor *)0x0) {
      if (perr != (cose_errback *)0x0) {
        perr->err = COSE_ERR_INVALID_PARAMETER;
      }
    }
    else {
      if (destination != 0) {
        if (destination == 1) {
          pcVar3 = cn_cbor_mapget_int(pKey,2);
          if (pcVar3 == (cn_cbor *)0x0) {
            if (perr != (cose_errback *)0x0) {
              perr->err = COSE_ERR_INVALID_PARAMETER;
            }
            goto LAB_00263dd4;
          }
          cn3 = cn_cbor_clone(pcVar3,&local_58);
          if (cn3 == (cn_cbor *)0x0) {
            if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR(local_58);
              perr->err = cVar2;
            }
            goto LAB_00263dd4;
          }
          _Var1 = _COSE_map_put((COSE *)h,-3,cn3,2,perr);
          if (!_Var1) {
            if (perr != (cose_errback *)0x0) {
              perr->err = perr->err;
            }
            goto LAB_00263dd4;
          }
        }
        else {
          if (destination != 2) {
            if (perr != (cose_errback *)0x0) {
              perr->err = COSE_ERR_INVALID_PARAMETER;
            }
            goto LAB_00263dd4;
          }
          cn3 = cn_cbor_map_create(&local_58);
          if (cn3 == (cn_cbor *)0x0) {
            if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR(local_58);
              perr->err = cVar2;
            }
            goto LAB_00263dd4;
          }
          pcVar3 = cn_cbor_mapget_int(pKey,1);
          if (pcVar3 == (cn_cbor *)0x0) {
            if (perr != (cose_errback *)0x0) {
              perr->err = COSE_ERR_INVALID_PARAMETER;
            }
            goto LAB_00263dd4;
          }
          cbor_err = (cn_cbor_errback)cn_cbor_clone(pcVar3,&local_58);
          if (cbor_err == (cn_cbor_errback)0x0) {
            if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR(local_58);
              perr->err = cVar2;
            }
            goto LAB_00263dd4;
          }
          _Var1 = cn_cbor_mapput_int(cn3,1,(cn_cbor *)cbor_err,&local_58);
          if (!_Var1) {
            if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR(local_58);
              perr->err = cVar2;
            }
            goto LAB_00263dd4;
          }
          cbor_err.pos = 0;
          cbor_err.err = CN_CBOR_NO_ERROR;
          pcVar3 = cn_cbor_mapget_int(pKey,-1);
          cbor_err = (cn_cbor_errback)cn_cbor_clone(pcVar3,&local_58);
          if (cbor_err == (cn_cbor_errback)0x0) {
            if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR(local_58);
              perr->err = cVar2;
            }
            goto LAB_00263dd4;
          }
          _Var1 = cn_cbor_mapput_int(cn3,-1,(cn_cbor *)cbor_err,&local_58);
          if (!_Var1) {
            if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR(local_58);
              perr->err = cVar2;
            }
            goto LAB_00263dd4;
          }
          cbor_err.pos = 0;
          cbor_err.err = CN_CBOR_NO_ERROR;
          pcVar3 = cn_cbor_mapget_int(pKey,-2);
          cbor_err = (cn_cbor_errback)cn_cbor_clone(pcVar3,&local_58);
          if (cbor_err == (cn_cbor_errback)0x0) {
            if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR(local_58);
              perr->err = cVar2;
            }
            goto LAB_00263dd4;
          }
          _Var1 = cn_cbor_mapput_int(cn3,-2,(cn_cbor *)cbor_err,&local_58);
          if (!_Var1) {
            if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR(local_58);
              perr->err = cVar2;
            }
            goto LAB_00263dd4;
          }
          cbor_err.pos = 0;
          cbor_err.err = CN_CBOR_NO_ERROR;
          pcVar3 = cn_cbor_mapget_int(pKey,-3);
          cbor_err = (cn_cbor_errback)cn_cbor_clone(pcVar3,&local_58);
          if (cbor_err == (cn_cbor_errback)0x0) {
            if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR(local_58);
              perr->err = cVar2;
            }
            goto LAB_00263dd4;
          }
          _Var1 = cn_cbor_mapput_int(cn3,-3,(cn_cbor *)cbor_err,&local_58);
          if (!_Var1) {
            if (perr != (cose_errback *)0x0) {
              cVar2 = _MapFromCBOR(local_58);
              perr->err = cVar2;
            }
            goto LAB_00263dd4;
          }
          cbor_err.pos = 0;
          cbor_err.err = CN_CBOR_NO_ERROR;
          _Var1 = _COSE_map_put((COSE *)h,-2,cn3,2,perr);
          if (!_Var1) {
            if (perr != (cose_errback *)0x0) {
              perr->err = perr->err;
            }
            goto LAB_00263dd4;
          }
        }
      }
      cn3 = (cn_cbor *)0x0;
      *(cn_cbor **)(h + 0x80) = pKey;
      cn._7_1_ = true;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
LAB_00263dd4:
  if (cn3 != (cn_cbor *)0x0) {
    cn_cbor_free(cn3);
  }
  if (cbor_err != (cn_cbor_errback)0x0) {
    cn_cbor_free((cn_cbor *)cbor_err);
  }
  return cn._7_1_;
}

Assistant:

bool COSE_Recipient_SetSenderKey(HCOSE_RECIPIENT h, const cn_cbor * pKey, int destination, cose_errback * perr)
{
	COSE_RecipientInfo * p;
	bool f = false;
	cn_cbor * cn;
	cn_cbor * cn2 = NULL;
	cn_cbor * cn3 = NULL;
	cn_cbor_errback cbor_err;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
#endif

	CHECK_CONDITION(IsValidRecipientHandle(h), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(pKey != NULL, COSE_ERR_INVALID_PARAMETER);

	p = (COSE_RecipientInfo *)h;

#ifdef USE_CBOR_CONTEXT
	context = &p->m_encrypt.m_message.m_allocContext;
#endif

	switch (destination) {
	case 0:
		break;

	case 1:
		cn = cn_cbor_mapget_int(pKey, COSE_Key_ID);
		CHECK_CONDITION(cn != NULL, COSE_ERR_INVALID_PARAMETER);
		cn2 = cn_cbor_clone(cn, CBOR_CONTEXT_PARAM_COMMA &cbor_err);
		CHECK_CONDITION_CBOR(cn2 != NULL, cbor_err);
		CHECK_CONDITION(_COSE_map_put(&p->m_encrypt.m_message, COSE_Header_ECDH_SPK_KID, cn2, COSE_UNPROTECT_ONLY, perr), perr->err);
		cn2 = NULL;
		break;

	case 2:
		cn2 = cn_cbor_map_create(CBOR_CONTEXT_PARAM_COMMA &cbor_err);
		CHECK_CONDITION_CBOR(cn2 != NULL, cbor_err);
		cn = cn_cbor_mapget_int(pKey, COSE_Key_Type);
		CHECK_CONDITION(cn != NULL, COSE_ERR_INVALID_PARAMETER);
		cn3 = cn_cbor_clone(cn, CBOR_CONTEXT_PARAM_COMMA &cbor_err);
		CHECK_CONDITION_CBOR(cn3 != NULL, cbor_err);
		CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn2, COSE_Key_Type, cn3, CBOR_CONTEXT_PARAM_COMMA &cbor_err), cbor_err);
		cn3 = NULL;
		cn = cn_cbor_mapget_int(pKey, COSE_Key_EC2_Curve);
		cn3 = cn_cbor_clone(cn, CBOR_CONTEXT_PARAM_COMMA &cbor_err);
		CHECK_CONDITION_CBOR(cn3 != NULL, cbor_err);
		CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn2, COSE_Key_EC2_Curve, cn3, CBOR_CONTEXT_PARAM_COMMA &cbor_err), cbor_err);
		cn3 = NULL;
		cn = cn_cbor_mapget_int(pKey, COSE_Key_EC2_X);
		cn3 = cn_cbor_clone(cn, CBOR_CONTEXT_PARAM_COMMA &cbor_err);
		CHECK_CONDITION_CBOR(cn3 != NULL, cbor_err);
		CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn2, COSE_Key_EC2_X, cn3, CBOR_CONTEXT_PARAM_COMMA &cbor_err), cbor_err);
		cn3 = NULL;
		cn = cn_cbor_mapget_int(pKey, COSE_Key_EC2_Y);
		cn3 = cn_cbor_clone(cn, CBOR_CONTEXT_PARAM_COMMA &cbor_err);
		CHECK_CONDITION_CBOR(cn3 != NULL, cbor_err);
		CHECK_CONDITION_CBOR(cn_cbor_mapput_int(cn2, COSE_Key_EC2_Y, cn3, CBOR_CONTEXT_PARAM_COMMA &cbor_err), cbor_err);
		cn3 = NULL;
		CHECK_CONDITION(_COSE_map_put(&p->m_encrypt.m_message, COSE_Header_ECDH_SPK, cn2, COSE_UNPROTECT_ONLY, perr), perr->err);
		cn2 = NULL;
		break;

	default:
		FAIL_CONDITION(COSE_ERR_INVALID_PARAMETER);
	}

	p->m_pkeyStatic = pKey;

	f = true;
errorReturn:
	if (cn2 != NULL) CN_CBOR_FREE(cn2, context);
	if (cn3 != NULL) CN_CBOR_FREE(cn3, context);
	return f;
}